

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O0

void store_storefile(png_store *ps,png_uint_32 id)

{
  uint uVar1;
  png_store_file *ppVar2;
  png_store_file *pf;
  png_uint_32 id_local;
  png_store *ps_local;
  
  if ((((ps->chunkpos != 0) || (ps->chunktype != 0)) || (ps->chunklen != 0)) || (ps->IDAT_size == 0)
     ) {
    png_error(ps->pwrite,"storefile: incomplete write");
  }
  ppVar2 = (png_store_file *)malloc(0x270);
  if (ppVar2 == (png_store_file *)0x0) {
    png_error(ps->pwrite,"storefile: OOM");
  }
  safecat(ppVar2->name,0x40,0,ps->wname);
  ppVar2->id = id;
  memcpy(&ppVar2->data,&ps->new,0x200);
  ppVar2->datacount = ps->writepos;
  ppVar2->IDAT_size = ps->IDAT_size;
  uVar1 = bits_of(ps->IDAT_size);
  ppVar2->IDAT_bits = uVar1;
  if (ppVar2->IDAT_bits == 0) {
    png_error(ps->pwrite,"storefile: 0 sized IDAT");
  }
  (ps->new).prev = (png_store_buffer *)0x0;
  ps->writepos = 0;
  ps->chunkpos = 8;
  ps->chunktype = 0;
  ps->chunklen = 0x10;
  ps->IDAT_size = 0;
  ppVar2->palette = ps->palette;
  ppVar2->npalette = ps->npalette;
  ps->palette = (store_palette_entry *)0x0;
  ps->npalette = 0;
  ppVar2->next = ps->saved;
  ps->saved = ppVar2;
  return;
}

Assistant:

static void
store_storefile(png_store *ps, png_uint_32 id)
{
   png_store_file *pf;

   if (ps->chunkpos != 0U || ps->chunktype != 0U || ps->chunklen != 0U ||
       ps->IDAT_size == 0)
      png_error(ps->pwrite, "storefile: incomplete write");

   pf = voidcast(png_store_file*, malloc(sizeof *pf));
   if (pf == NULL)
      png_error(ps->pwrite, "storefile: OOM");
   safecat(pf->name, sizeof pf->name, 0, ps->wname);
   pf->id = id;
   pf->data = ps->new;
   pf->datacount = ps->writepos;
   pf->IDAT_size = ps->IDAT_size;
   pf->IDAT_bits = bits_of(ps->IDAT_size);
   /* Because the IDAT always has zlib header stuff this must be true: */
   if (pf->IDAT_bits == 0U)
      png_error(ps->pwrite, "storefile: 0 sized IDAT");
   ps->new.prev = NULL;
   ps->writepos = 0;
   ps->chunkpos = 8;
   ps->chunktype = 0;
   ps->chunklen = 16;
   ps->IDAT_size = 0;
   pf->palette = ps->palette;
   pf->npalette = ps->npalette;
   ps->palette = 0;
   ps->npalette = 0;

   /* And save it. */
   pf->next = ps->saved;
   ps->saved = pf;
}